

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReplaceExisting.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 *puVar7;
  uint uVar8;
  undefined4 in_register_0000003c;
  char *pcVar9;
  ulong uVar10;
  int local_44;
  char *local_38;
  
  uVar4 = json_object_new_object(CONCAT44(in_register_0000003c,argc));
  uVar5 = json_object_new_string("bar1");
  json_object_object_add(uVar4,"foo1",uVar5);
  uVar5 = json_object_new_string("bar2");
  json_object_object_add(uVar4,"foo2",uVar5);
  uVar5 = json_object_new_string("bar2");
  json_object_object_add(uVar4,"deleteme",uVar5);
  uVar5 = json_object_new_string("bar3");
  json_object_object_add(uVar4,"foo3",uVar5);
  puts("==== delete-in-loop test starting ====");
  lVar6 = json_object_get_object(uVar4);
  uVar8 = 0;
  puVar7 = *(undefined8 **)(lVar6 + 8);
  while (puVar7 != (undefined8 *)0x0) {
    pcVar1 = (char *)*puVar7;
    puVar2 = (undefined8 *)puVar7[3];
    printf("Key at index %d is [%s] %d",(ulong)uVar8,pcVar1,(ulong)(puVar7[2] == 0));
    iVar3 = strcmp(pcVar1,"deleteme");
    pcVar9 = " (kept)";
    if (iVar3 == 0) {
      json_object_object_del(uVar4,pcVar1);
      pcVar9 = " (deleted)";
    }
    puts(pcVar9);
    uVar8 = uVar8 + 1;
    puVar7 = puVar2;
  }
  puts("==== replace-value first loop starting ====");
  lVar6 = json_object_get_object(uVar4);
  local_38 = (char *)0x0;
  uVar8 = 0;
  puVar7 = *(undefined8 **)(lVar6 + 8);
  while (puVar7 != (undefined8 *)0x0) {
    pcVar1 = (char *)*puVar7;
    puVar2 = (undefined8 *)puVar7[3];
    printf("Key at index %d is [%s] %d\n",(ulong)uVar8,pcVar1,(ulong)(puVar7[2] == 0));
    uVar8 = uVar8 + 1;
    iVar3 = strcmp(pcVar1,"foo2");
    puVar7 = puVar2;
    if (iVar3 == 0) {
      printf("replacing value for key [%s]\n",pcVar1);
      uVar5 = json_object_new_string("zzz");
      json_object_object_add(uVar4,pcVar1,uVar5);
      local_38 = pcVar1;
    }
  }
  puts("==== second loop starting ====");
  lVar6 = json_object_get_object(uVar4);
  local_44 = 0;
  uVar10 = 0;
  puVar7 = *(undefined8 **)(lVar6 + 8);
  while (puVar7 != (undefined8 *)0x0) {
    pcVar1 = (char *)*puVar7;
    puVar2 = (undefined8 *)puVar7[3];
    printf("Key at index %d is [%s] %d\n",uVar10,pcVar1,(ulong)(puVar7[2] == 0));
    uVar10 = (ulong)((uint)uVar10 + 1);
    iVar3 = strcmp(pcVar1,"foo2");
    puVar7 = puVar2;
    if (iVar3 == 0) {
      pcVar9 = "NOT ";
      if (pcVar1 == local_38) {
        pcVar9 = "";
      }
      else {
        local_44 = 1;
      }
      printf("pointer for key [%s] does %smatch\n",pcVar1,pcVar9);
    }
  }
  if (uVar8 != (uint)uVar10) {
    printf("mismatch between original count (%d) and new count (%d)\n",(ulong)uVar8,uVar10);
    local_44 = 1;
  }
  json_object_put(uVar4);
  return local_44;
}

Assistant:

int main(int argc, char **argv)
{
	MC_SET_DEBUG(1);

	/*
	 * Check that replacing an existing object keeps the key valid,
	 * and that it keeps the order the same.
	 */
	json_object *my_object = json_object_new_object();
	json_object_object_add(my_object, "foo1", json_object_new_string("bar1"));
	json_object_object_add(my_object, "foo2", json_object_new_string("bar2"));
	json_object_object_add(my_object, "deleteme", json_object_new_string("bar2"));
	json_object_object_add(my_object, "foo3", json_object_new_string("bar3"));

	printf("==== delete-in-loop test starting ====\n");

	int orig_count = 0;
	json_object_object_foreach(my_object, key0, val0)
	{
		printf("Key at index %d is [%s] %d", orig_count, key0, (val0 == NULL));
		if (strcmp(key0, "deleteme") == 0)
		{
			json_object_object_del(my_object, key0);
			printf(" (deleted)\n");
		}
		else
			printf(" (kept)\n");
		orig_count++;
	}

	printf("==== replace-value first loop starting ====\n");

	const char *original_key = NULL;
	orig_count = 0;
	json_object_object_foreach(my_object, key, val)
	{
		printf("Key at index %d is [%s] %d\n", orig_count, key, (val == NULL));
		orig_count++;
		if (strcmp(key, "foo2") != 0)
			continue;
		printf("replacing value for key [%s]\n", key);
		original_key = key;
		json_object_object_add(my_object, key, json_object_new_string("zzz"));
	}

	printf("==== second loop starting ====\n");

	int new_count = 0;
	int retval = 0;
	json_object_object_foreach(my_object, key2, val2)
	{
		printf("Key at index %d is [%s] %d\n", new_count, key2, (val2 == NULL));
		new_count++;
		if (strcmp(key2, "foo2") != 0)
			continue;
		printf("pointer for key [%s] does %smatch\n", key2,
		       (key2 == original_key) ? "" : "NOT ");
		if (key2 != original_key)
			retval = 1;
	}
	if (new_count != orig_count)
	{
		printf("mismatch between original count (%d) and new count (%d)\n", orig_count,
		       new_count);
		retval = 1;
	}

	json_object_put(my_object);

	return retval;
}